

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cProgramInterfaceQueryTests.cpp
# Opt level: O2

string * __thiscall
glcts::(anonymous_namespace)::QueryNotUsed::VertexShader2_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "#version 310 es                      \nin mediump vec4 p;                   \nvoid main(void)                      \n{                                    \n    gl_Position = p;                 \n}"
             ,&local_9);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string VertexShader2()
	{
		return "#version 310 es                      \n"
			   "in mediump vec4 p;                   \n"
			   "void main(void)                      \n"
			   "{                                    \n"
			   "    gl_Position = p;                 \n"
			   "}";
	}